

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall cfd::js::api::json::VerifySignRequest::VerifySignRequest(VerifySignRequest *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_21;
  
  (this->super_JsonClassBase<cfd::js::api::json::VerifySignRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__VerifySignRequest_00b3be80;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->tx_,"",&local_21);
  this->is_elements_ = false;
  (this->txins_).super_JsonVector<cfd::js::api::json::VerifySignTxInUtxoData>.
  super_vector<cfd::js::api::json::VerifySignTxInUtxoData,_std::allocator<cfd::js::api::json::VerifySignTxInUtxoData>_>
  .
  super__Vector_base<cfd::js::api::json::VerifySignTxInUtxoData,_std::allocator<cfd::js::api::json::VerifySignTxInUtxoData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::VerifySignTxInUtxoData>.
  super_vector<cfd::js::api::json::VerifySignTxInUtxoData,_std::allocator<cfd::js::api::json::VerifySignTxInUtxoData>_>
  .
  super__Vector_base<cfd::js::api::json::VerifySignTxInUtxoData,_std::allocator<cfd::js::api::json::VerifySignTxInUtxoData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::VerifySignTxInUtxoData>.
  super_vector<cfd::js::api::json::VerifySignTxInUtxoData,_std::allocator<cfd::js::api::json::VerifySignTxInUtxoData>_>
  .
  super__Vector_base<cfd::js::api::json::VerifySignTxInUtxoData,_std::allocator<cfd::js::api::json::VerifySignTxInUtxoData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::VerifySignTxInUtxoData>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00b3bf18;
  CollectFieldName();
  return;
}

Assistant:

VerifySignRequest() {
    CollectFieldName();
  }